

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O0

void __thiscall VertexAttrib64Bit::Base::LinkProgram(Base *this,GLuint id)

{
  glGetProgramInfoLogFunc p_Var1;
  TestLog *this_00;
  undefined4 uVar2;
  GLint GVar3;
  GLenum GVar4;
  reference pvVar5;
  MessageBuilder *pMVar6;
  TestError *this_01;
  reference local_260;
  MessageBuilder local_258;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  LogSection local_88;
  undefined1 local_38 [8];
  vector<char,_std::allocator<char>_> message;
  GLint local_18;
  GLint message_length;
  GLint status;
  GLuint id_local;
  Base *this_local;
  
  local_18 = 0;
  message_length = id;
  _status = this;
  (*(this->gl).linkProgram)(id);
  GVar4 = (*(this->gl).getError)();
  glu::checkError(GVar4,"LinkProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xd7);
  (*(this->gl).getProgramiv)(message_length,0x8b82,&local_18);
  GVar4 = (*(this->gl).getError)();
  glu::checkError(GVar4,"GetProgramiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xda);
  if (local_18 == 0) {
    message.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_38);
    (*(this->gl).getProgramiv)
              (message_length,0x8b84,
               (GLint *)&message.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x14)
    ;
    GVar4 = (*(this->gl).getError)();
    glu::checkError(GVar4,"GetProgramiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                    ,0xe2);
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)local_38,
               (long)(message.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ + 1));
    GVar3 = message_length;
    uVar2 = message.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_;
    p_Var1 = (this->gl).getProgramInfoLog;
    pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_38,0);
    (*p_Var1)(GVar3,uVar2,
              (GLsizei *)&message.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x14
              ,pvVar5);
    GVar4 = (*(this->gl).getError)();
    glu::checkError(GVar4,"GetProgramInfoLog",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                    ,0xe7);
    this_00 = this->m_log;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"Program link error",&local_a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"",&local_d1);
    tcu::LogSection::LogSection(&local_88,&local_a8,&local_d0);
    tcu::TestLog::operator<<(this_00,&local_88);
    tcu::LogSection::~LogSection(&local_88);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    tcu::TestLog::operator<<(&local_258,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_258,(char (*) [11])"Link log:\n");
    local_260 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)local_38,0);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_260);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_258);
    tcu::TestLog::operator<<(this->m_log,(EndSectionToken *)&tcu::TestLog::EndSection);
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Program linking failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
               ,0xef);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void Base::LinkProgram(GLuint id) const
{
	GLint status = 0;
	gl.linkProgram(id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "LinkProgram");

	gl.getProgramiv(id, GL_LINK_STATUS, &status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramiv");

	if (GL_FALSE == status)
	{
		GLint				message_length = 0;
		std::vector<GLchar> message;

		gl.getProgramiv(id, GL_INFO_LOG_LENGTH, &message_length);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramiv");

		message.resize(message_length + 1);

		gl.getProgramInfoLog(id, message_length, &message_length, &message[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramInfoLog");

		m_log << tcu::TestLog::Section("Program link error", "");

		m_log << tcu::TestLog::Message << "Link log:\n" << &message[0] << tcu::TestLog::EndMessage;

		m_log << tcu::TestLog::EndSection;

		TCU_FAIL("Program linking failed");
	}
}